

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

VirtualInterfaceTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::VirtualInterfaceTypeSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ParameterValueAssignmentSyntax*&,slang::syntax::DotMemberClauseSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,
          ParameterValueAssignmentSyntax **args_3,DotMemberClauseSyntax **args_4)

{
  Token virtualKeyword;
  Token interfaceKeyword;
  Token name;
  VirtualInterfaceTypeSyntax *this_00;
  DotMemberClauseSyntax **args_local_4;
  ParameterValueAssignmentSyntax **args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (VirtualInterfaceTypeSyntax *)allocate(this,0x50,8);
  virtualKeyword.kind = args->kind;
  virtualKeyword._2_1_ = args->field_0x2;
  virtualKeyword.numFlags.raw = (args->numFlags).raw;
  virtualKeyword.rawLen = args->rawLen;
  virtualKeyword.info = args->info;
  interfaceKeyword.kind = args_1->kind;
  interfaceKeyword._2_1_ = args_1->field_0x2;
  interfaceKeyword.numFlags.raw = (args_1->numFlags).raw;
  interfaceKeyword.rawLen = args_1->rawLen;
  interfaceKeyword.info = args_1->info;
  name.kind = args_2->kind;
  name._2_1_ = args_2->field_0x2;
  name.numFlags.raw = (args_2->numFlags).raw;
  name.rawLen = args_2->rawLen;
  name.info = args_2->info;
  slang::syntax::VirtualInterfaceTypeSyntax::VirtualInterfaceTypeSyntax
            (this_00,virtualKeyword,interfaceKeyword,name,*args_3,*args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }